

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O0

spv_context spvContextCreate(spv_target_env env)

{
  spv_context psVar1;
  spv_ext_inst_table local_30;
  spv_ext_inst_table ext_inst_table;
  spv_operand_table operand_table;
  spv_opcode_table opcode_table;
  spv_context psStack_10;
  spv_target_env env_local;
  
  if ((env < SPV_ENV_WEBGPU_0) || (env - SPV_ENV_UNIVERSAL_1_4 < 7)) {
    opcode_table._4_4_ = env;
    spvOpcodeTableGet((spv_opcode_table *)&operand_table,env);
    spvOperandTableGet((spv_operand_table *)&ext_inst_table,opcode_table._4_4_);
    spvExtInstTableGet(&local_30,opcode_table._4_4_);
    psVar1 = (spv_context)operator_new(0x40);
    psVar1->target_env = opcode_table._4_4_;
    psVar1->opcode_table = (spv_opcode_table)operand_table;
    psVar1->operand_table = (spv_operand_table)ext_inst_table;
    psVar1->ext_inst_table = local_30;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    function(&psVar1->consumer,(nullptr_t)0x0);
    psStack_10 = psVar1;
  }
  else {
    psStack_10 = (spv_context)0x0;
  }
  return psStack_10;
}

Assistant:

spv_context spvContextCreate(spv_target_env env) {
  switch (env) {
    case SPV_ENV_UNIVERSAL_1_0:
    case SPV_ENV_VULKAN_1_0:
    case SPV_ENV_UNIVERSAL_1_1:
    case SPV_ENV_OPENCL_1_2:
    case SPV_ENV_OPENCL_EMBEDDED_1_2:
    case SPV_ENV_OPENCL_2_0:
    case SPV_ENV_OPENCL_EMBEDDED_2_0:
    case SPV_ENV_OPENCL_2_1:
    case SPV_ENV_OPENCL_EMBEDDED_2_1:
    case SPV_ENV_OPENCL_2_2:
    case SPV_ENV_OPENCL_EMBEDDED_2_2:
    case SPV_ENV_OPENGL_4_0:
    case SPV_ENV_OPENGL_4_1:
    case SPV_ENV_OPENGL_4_2:
    case SPV_ENV_OPENGL_4_3:
    case SPV_ENV_OPENGL_4_5:
    case SPV_ENV_UNIVERSAL_1_2:
    case SPV_ENV_UNIVERSAL_1_3:
    case SPV_ENV_VULKAN_1_1:
    case SPV_ENV_VULKAN_1_1_SPIRV_1_4:
    case SPV_ENV_UNIVERSAL_1_4:
    case SPV_ENV_UNIVERSAL_1_5:
    case SPV_ENV_VULKAN_1_2:
    case SPV_ENV_UNIVERSAL_1_6:
    case SPV_ENV_VULKAN_1_3:
    case SPV_ENV_VULKAN_1_4:
      break;
    default:
      return nullptr;
  }

  spv_opcode_table opcode_table;
  spv_operand_table operand_table;
  spv_ext_inst_table ext_inst_table;

  spvOpcodeTableGet(&opcode_table, env);
  spvOperandTableGet(&operand_table, env);
  spvExtInstTableGet(&ext_inst_table, env);

  return new spv_context_t{env, opcode_table, operand_table, ext_inst_table,
                           nullptr /* a null default consumer */};
}